

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_run_data(stbi__write_context *s,int length,uchar databyte)

{
  char local_16;
  uchar local_15;
  int local_14;
  uchar lengthbyte;
  uchar databyte_local;
  stbi__write_context *psStack_10;
  int length_local;
  stbi__write_context *s_local;
  
  local_16 = (char)length + -0x80;
  local_15 = databyte;
  local_14 = length;
  psStack_10 = s;
  if (length + 0x80 < 0x100) {
    (*s->func)(s->context,&local_16,1);
    (*psStack_10->func)(psStack_10->context,&local_15,1);
    return;
  }
  __assert_fail("length+128 <= 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image_write.h"
                ,499,"void stbiw__write_run_data(stbi__write_context *, int, unsigned char)");
}

Assistant:

void stbiw__write_run_data(stbi__write_context *s, int length, unsigned char databyte)
{
   unsigned char lengthbyte = STBIW_UCHAR(length+128);
   STBIW_ASSERT(length+128 <= 255);
   s->func(s->context, &lengthbyte, 1);
   s->func(s->context, &databyte, 1);
}